

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

Entry * __thiscall
Lib::
DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntryToInsert(DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                    *this,Unit **key)

{
  Unit *pUVar1;
  uint uVar2;
  Entry *pEVar3;
  size_t i;
  long lVar4;
  ulong uVar5;
  byte local_14 [4];
  
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  uVar2 = 0x811c9dc5;
  lVar4 = 0;
  do {
    uVar2 = (local_14[lVar4] ^ uVar2) * 0x1000193;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  uVar5 = (ulong)uVar2 % (ulong)(uint)this->_capacity;
  pEVar3 = this->_entries + (int)uVar5;
  if (((uint)(pEVar3->field_0)._infoData >> 2 == this->_timestamp) && (pEVar3->_key != *key)) {
    (pEVar3->field_0)._infoData = (pEVar3->field_0)._infoData | 2;
    pUVar1 = *key;
    if (pUVar1 == (Unit *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = pUVar1->_number;
    }
    uVar2 = uVar2 % (uint)this->_capacity;
    do {
      uVar5 = (ulong)((int)uVar5 + uVar2 + (uVar2 == 0)) % (ulong)(uint)this->_capacity;
      pEVar3 = this->_entries + (int)uVar5;
      if ((uint)(pEVar3->field_0)._infoData >> 2 != this->_timestamp) {
        return pEVar3;
      }
    } while (pEVar3->_key != pUVar1);
  }
  return pEVar3;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }